

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

string * __thiscall
Catch::RunContext::getCurrentTestName_abi_cxx11_(string *__return_storage_ptr__,RunContext *this)

{
  TestCaseInfo *pTVar1;
  pointer pcVar2;
  
  if (this->m_activeTestCase == (TestCaseHandle *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    pTVar1 = this->m_activeTestCase->m_info;
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (pTVar1->name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pTVar1->name)._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string RunContext::getCurrentTestName() const {
        return m_activeTestCase
            ? m_activeTestCase->getTestCaseInfo().name
            : std::string();
    }